

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O0

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::CloneProperties
          (DeserializationCloner<Js::StreamReader> *this,SrcTypeId typeId,Src src,Dst dst)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  scaposition_t sVar4;
  undefined4 *puVar5;
  Engine *pEVar6;
  void *local_58;
  Dst value_1;
  JavascriptArray *pJStack_48;
  uint32 i_1;
  JavascriptArray *arr_1;
  Dst value;
  uint32 i;
  uint32 length;
  JavascriptArray *arr;
  RecyclableObject *obj;
  Dst dst_local;
  Src src_local;
  SrcTypeId typeId_local;
  DeserializationCloner<Js::StreamReader> *this_local;
  
  obj = (RecyclableObject *)dst;
  dst_local._0_4_ = src;
  dst_local._4_4_ = typeId;
  _src_local = this;
  arr = (JavascriptArray *)VarTo<Js::RecyclableObject>(dst);
  BVar3 = RecyclableObject::IsExternal((RecyclableObject *)arr);
  if (BVar3 == 0) {
    if (dst_local._4_4_ == SCA_DenseArray) {
      _i = Js::JavascriptArray::FromAnyArray(arr);
      value._4_4_ = ArrayObject::GetLength(&_i->super_ArrayObject);
      for (value._0_4_ = 0; (uint)value < value._4_4_; value._0_4_ = (uint)value + 1) {
        arr_1 = (JavascriptArray *)0x0;
        pEVar6 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                 ::GetEngine(&this->
                              super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                            );
        sVar4 = StreamReader::GetPosition(this->m_reader);
        SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
                  (pEVar6,sVar4,&arr_1);
        if (arr_1 != (JavascriptArray *)0x0) {
          Js::JavascriptArray::DirectSetItemAt<void*>(_i,(uint)value,arr_1);
        }
      }
    }
    else if (dst_local._4_4_ == SCA_SparseArray) {
      pJStack_48 = Js::JavascriptArray::FromAnyArray(arr);
      while (Read(this,(uint32 *)((long)&value_1 + 4)), value_1._4_4_ != 0xffffffff) {
        local_58 = (Var)0x0;
        pEVar6 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                 ::GetEngine(&this->
                              super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                            );
        sVar4 = StreamReader::GetPosition(this->m_reader);
        SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
                  (pEVar6,sVar4,&local_58);
        if (local_58 == (Var)0x0) {
          ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
        }
        Js::JavascriptArray::DirectSetItemAt<void*>(pJStack_48,value_1._4_4_,local_58);
      }
    }
    ReadObjectPropertiesIntoObject(this,(RecyclableObject *)arr);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCADeserialization.cpp"
                                ,0x13d,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return;
}

Assistant:

void DeserializationCloner<Reader>::CloneProperties(SrcTypeId typeId, Src src, Dst dst)
    {
        // ScriptContext* scriptContext = GetScriptContext();
        RecyclableObject* obj = VarTo<RecyclableObject>(dst);

        if (obj->IsExternal()) // Read host object properties
        {
            Assert(false);
        }
        else // Read native object properties
        {
            // Read array index named properties
            if (typeId == SCA_DenseArray)
            {
                JavascriptArray* arr = JavascriptArray::FromAnyArray(obj); // (might be ES5Array if -ForceES5Array)
                uint32 length = arr->GetLength();
                for (uint32 i = 0; i < length; i++)
                {
                    Dst value = NULL;
                    this->GetEngine()->Clone(m_reader->GetPosition(), &value);
                    if (value)
                    {
                        arr->DirectSetItemAt(i, value); //Note: no prototype check
                    }
                }
            }
            else if (typeId == SCA_SparseArray)
            {
                JavascriptArray* arr = JavascriptArray::FromAnyArray(obj); // (might be ES5Array if -ForceES5Array)
                while (true)
                {
                    uint32 i;
                    Read(&i);
                    if (i == SCA_PROPERTY_TERMINATOR)
                    {
                        break;
                    }

                    Dst value = NULL;
                    this->GetEngine()->Clone(m_reader->GetPosition(), &value);
                    if (value == NULL)
                    {
                        this->ThrowSCADataCorrupt();
                    }

                    arr->DirectSetItemAt(i, value); //Note: no prototype check
                }
            }

            // Read non-index named properties
            ReadObjectPropertiesIntoObject(obj);
        }
    }